

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O0

bool __thiscall
ggml::cpu::aarch64::extra_buffer_type::supports_op
          (extra_buffer_type *this,ggml_backend_dev_t param_2,ggml_tensor *op)

{
  ggml_backend_buffer_type_t pgVar1;
  int iVar2;
  ggml_backend_buffer_type_t pgVar3;
  tensor_traits *ptVar4;
  ulong uVar5;
  long in_RDX;
  ggml_tensor *in_stack_ffffffffffffffc8;
  
  if ((((*(int *)(in_RDX + 0x50) == 0x1b) && (*(long *)(*(long *)(in_RDX + 0x98) + 8) != 0)) &&
      (iVar2 = ggml_n_dims(*(undefined8 *)(in_RDX + 0x98)), iVar2 == 2)) &&
     ((pgVar1 = *(ggml_backend_buffer_type_t *)(*(long *)(*(long *)(in_RDX + 0x98) + 8) + 0x48),
      pgVar3 = ggml_backend_cpu_aarch64_buffer_type(), pgVar1 == pgVar3 &&
      (ptVar4 = ggml_aarch64_get_optimal_repack_type(in_stack_ffffffffffffffc8),
      ptVar4 != (tensor_traits *)0x0)))) {
    if ((*(long *)(*(long *)(in_RDX + 0xa0) + 8) != 0) &&
       (uVar5 = ggml_backend_buft_is_host
                          (*(undefined8 *)(*(long *)(*(long *)(in_RDX + 0xa0) + 8) + 0x48)),
       (uVar5 & 1) == 0)) {
      return false;
    }
    if (**(int **)(in_RDX + 0xa0) == 0) {
      return true;
    }
  }
  else if ((((*(int *)(in_RDX + 0x50) == 0x1c) &&
            ((*(long *)(*(long *)(in_RDX + 0x98) + 8) != 0 &&
             (iVar2 = ggml_n_dims(*(undefined8 *)(in_RDX + 0x98)), iVar2 == 3)))) &&
           (pgVar1 = *(ggml_backend_buffer_type_t *)(*(long *)(*(long *)(in_RDX + 0x98) + 8) + 0x48)
           , pgVar3 = ggml_backend_cpu_aarch64_buffer_type(), pgVar1 == pgVar3)) &&
          (ptVar4 = ggml_aarch64_get_optimal_repack_type(in_stack_ffffffffffffffc8),
          ptVar4 != (tensor_traits *)0x0)) {
    if ((*(long *)(*(long *)(in_RDX + 0xa0) + 8) != 0) &&
       (uVar5 = ggml_backend_buft_is_host
                          (*(undefined8 *)(*(long *)(*(long *)(in_RDX + 0xa0) + 8) + 0x48)),
       (uVar5 & 1) == 0)) {
      return false;
    }
    if (**(int **)(in_RDX + 0xa0) == 0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool supports_op(ggml_backend_dev_t, const struct ggml_tensor * op) override {
        if (    op->op == GGML_OP_MUL_MAT &&
                op->src[0]->buffer &&
                (ggml_n_dims(op->src[0]) == 2) &&
                op->src[0]->buffer->buft == ggml_backend_cpu_aarch64_buffer_type() &&
                ggml_aarch64_get_optimal_repack_type(op->src[0])
                ) {
            if (op->src[1]->buffer && !ggml_backend_buft_is_host(op->src[1]->buffer->buft)) {
                return false;
            }
            if (op->src[1]->type == GGML_TYPE_F32) {
                return true;
            }
            //if (op->src[1]->type == GGML_TYPE_Q8_0) {
            //    return true;
            //}
            // may be possible if Q8_0 packed...
        } else if (op->op == GGML_OP_MUL_MAT_ID
                && op->src[0]->buffer
                && (ggml_n_dims(op->src[0]) == 3)
                && op->src[0]->buffer->buft == ggml_backend_cpu_aarch64_buffer_type()
                && ggml_aarch64_get_optimal_repack_type(op->src[0])
                ) {
            if (op->src[1]->buffer && !ggml_backend_buft_is_host(op->src[1]->buffer->buft)) {
                return false;
            }
            if (op->src[1]->type == GGML_TYPE_F32) {
                return true;
            }
            //if (op->src[1]->type == GGML_TYPE_Q8_0) {
            //    return true;
            //}
        }
        return false;
    }